

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

int run_test_fs_statfs(void)

{
  int iVar1;
  undefined1 local_1c0 [4];
  int r;
  uv_fs_t req;
  
  loop = uv_default_loop();
  iVar1 = uv_fs_statfs((uv_loop_t *)0x0,(uv_fs_t *)local_1c0,".",(uv_fs_cb)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x108e,"r == 0");
    abort();
  }
  statfs_cb((uv_fs_t *)local_1c0);
  if (statfs_cb_count != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x1090,"statfs_cb_count == 1");
    abort();
  }
  iVar1 = uv_fs_statfs(loop,(uv_fs_t *)local_1c0,".",statfs_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x1094,"r == 0");
    abort();
  }
  uv_run(loop,UV_RUN_DEFAULT);
  if (statfs_cb_count != 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0x1096,"statfs_cb_count == 2");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(fs_statfs) {
  uv_fs_t req;
  int r;

  loop = uv_default_loop();

  /* Test the synchronous version. */
  r = uv_fs_statfs(NULL, &req, ".", NULL);
  ASSERT(r == 0);
  statfs_cb(&req);
  ASSERT(statfs_cb_count == 1);

  /* Test the asynchronous version. */
  r = uv_fs_statfs(loop, &req, ".", statfs_cb);
  ASSERT(r == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(statfs_cb_count == 2);

  return 0;
}